

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,qulonglong number,int fieldWidth,
                 char32_t fillChar)

{
  QLocalePrivate *pQVar1;
  uint width;
  qsizetype qVar2;
  uint uVar3;
  char16_t *unicode;
  uint flags;
  QLocaleData *localeData;
  ulong uVar4;
  long padding;
  long in_FS_OFFSET;
  QStringView text;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  width = -fieldWidth;
  if (0 < fieldWidth) {
    width = fieldWidth;
  }
  uVar4 = (ulong)width;
  pQVar1 = (this->d).d.ptr;
  uVar3 = (~(pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
            super_QFlagsStorage<QLocale::NumberOption>.i & 1) * 0x20;
  flags = uVar3 + 2;
  if (fillChar != L'0') {
    flags = uVar3;
    width = 0xffffffff;
  }
  if (fieldWidth < 0) {
    flags = uVar3 + 4;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  localeData = (QLocaleData *)0xa;
  QLocaleData::unsLongLongToString(__return_storage_ptr__,pQVar1->m_data,number,-1,10,width,flags);
  text.m_data = (__return_storage_ptr__->d).ptr;
  text.m_size = (__return_storage_ptr__->d).size;
  qVar2 = stringWidth(text);
  padding = uVar4 - qVar2;
  if (padding != 0 && qVar2 <= (long)uVar4) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    calculateFiller(&local_58,padding,fillChar,(qsizetype)((this->d).d.ptr)->m_data,localeData);
    if (fieldWidth < 0) {
      QString::append(__return_storage_ptr__,&local_58);
    }
    else {
      unicode = local_58.d.ptr;
      if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
        unicode = &QString::_empty;
      }
      QString::insert(__return_storage_ptr__,0,(QChar *)unicode,local_58.d.size);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(qulonglong number, int fieldWidth, char32_t fillChar) const
{
    int absFieldWidth = qAbs(fieldWidth);
    int width = (fillChar == U'0') ? absFieldWidth : -1;
    unsigned flags = calculateFlags(fieldWidth, fillChar, *this);

    QString result = d->m_data->unsLongLongToString(number, -1, 10, width, flags);
    qsizetype padding = absFieldWidth - stringWidth(result);

    if (padding > 0) {
        QString filler = calculateFiller(padding, fillChar, fieldWidth, d->m_data);
        if (fieldWidth < 0)
            result.append(filler);
        else
            result.prepend(filler);
    }
    return result;
}